

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtSphereCylinderCollisionAlgorithm::processCollision
          (cbtSphereCylinderCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  bool bVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionShape *pcVar4;
  cbtPersistentManifold *this_00;
  float fVar5;
  float fVar6;
  cbtCollisionObjectWrapper *pcVar7;
  cbtCollisionObject *pcVar8;
  undefined1 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  cbtVector3 normalOnSurfaceB;
  cbtVector3 pos1;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  if (this->m_manifoldPtr == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar1 = this->m_isSwapped;
  uVar9 = 0;
  resultOut->m_manifoldPtr = this->m_manifoldPtr;
  pcVar7 = body1;
  if (bVar1 != false) {
    pcVar7 = body0;
    body0 = body1;
  }
  pcVar2 = body0->m_collisionObject;
  pcVar3 = pcVar7->m_collisionObject;
  pcVar4 = pcVar7->m_shape;
  fVar6 = (pcVar2->m_worldTransform).m_origin.m_floats[1] -
          (pcVar3->m_worldTransform).m_origin.m_floats[1];
  fVar20 = (pcVar2->m_worldTransform).m_origin.m_floats[0] -
           (pcVar3->m_worldTransform).m_origin.m_floats[0];
  fVar21 = (pcVar2->m_worldTransform).m_origin.m_floats[2] -
           (pcVar3->m_worldTransform).m_origin.m_floats[2];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar3->m_worldTransform).m_basis.m_el[1].
                                                   m_floats[0])),ZEXT416((uint)fVar20),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[0]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar21),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[0]));
  fVar28 = auVar15._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar3->m_worldTransform).m_basis.m_el[1].
                                                   m_floats[1])),ZEXT416((uint)fVar20),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[1]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar3->m_worldTransform).m_basis.m_el[1].
                                                   m_floats[2])),ZEXT416((uint)fVar20),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[2]));
  fVar5 = *(float *)&body0->m_shape[1].field_0xc * *(float *)&body0->m_shape->field_0x1c;
  local_38 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar21),
                             ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[1]));
  auVar15 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar21),
                            ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  fVar6 = *(float *)&pcVar4[1].field_0xc;
  fVar20 = auVar15._0_4_;
  fVar21 = fVar6;
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  local_48 = fVar21;
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  fVar6 = local_48 + fVar6;
  auVar17 = ZEXT416((uint)fVar6);
  uVar18 = *(undefined8 *)&pcVar4[1].field_0xc;
  local_48 = (float)uVar18;
  uStack_44 = (undefined4)((ulong)uVar18 >> 0x20);
  uStack_40 = 0;
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  fVar21 = (float)uVar18;
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  (*pcVar4->_vptr_cbtCollisionShape[0xc])(pcVar4);
  auVar15._4_4_ = uStack_44;
  auVar15._0_4_ = local_48;
  auVar15._8_8_ = uStack_40;
  auVar15 = vmovshdup_avx(auVar15);
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(ZEXT416((uint)(auVar15._0_4_ + fVar21)),auVar11);
  auVar15 = vfmadd231ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
  auVar12 = SUB6416(ZEXT464(0x3f800000),0);
  auVar11 = vucomiss_avx512f(local_38);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  fVar21 = auVar15._0_4_;
  auVar15 = local_38;
  if (((bool)uVar9) || (auVar15 = vucomiss_avx512f(auVar10), (bool)uVar9)) {
    uVar18 = vcmpss_avx512f(auVar15,auVar10,1);
    bVar1 = (bool)((byte)uVar18 & 1);
    fVar29 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * 0x3f800000);
    if (fVar21 <= fVar6) {
      fVar6 = (pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[1];
      fVar21 = (pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar26 = (pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[1];
      auVar31._0_12_ = ZEXT812(0);
      auVar31._12_4_ = 0;
      auVar16 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[0]);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar6)),auVar16,auVar31);
      auVar25 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[0]);
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar29)),auVar25,auVar31);
      auVar23 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[0]);
      auVar17 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar26 * fVar29)),auVar23,auVar31);
      auVar24 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[2]);
      auVar10 = vfmadd231ss_fma(auVar10,auVar24,auVar31);
      auVar27 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[2]);
      auVar12 = vfmadd231ss_fma(auVar12,auVar27,auVar31);
      auVar22 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[2]);
      auVar17 = vfmadd231ss_fma(auVar17,auVar22,auVar31);
      auVar10 = vinsertps_avx(auVar10,auVar12,0x10);
      local_68 = vinsertps_avx(auVar10,auVar17,0x28);
      fVar28 = fVar28 + 0.0;
      auVar15 = vsubss_avx512f(auVar15,auVar11);
      auVar15 = vfmsub213ss_fma(auVar15,ZEXT416((uint)fVar29),ZEXT416((uint)fVar5));
      uVar19 = auVar15._0_8_;
      fVar5 = auVar11._0_4_ * fVar29 + 0.0;
      fVar20 = fVar20 + 0.0;
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),ZEXT416((uint)fVar28),auVar16);
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar5)),ZEXT416((uint)fVar28),auVar25);
      auVar10 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar26 * fVar5)),ZEXT416((uint)fVar28),auVar23);
      auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar20),auVar24);
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar20),auVar27);
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar20),auVar22);
      auVar15 = vinsertps_avx(ZEXT416((uint)(auVar15._0_4_ +
                                            (pcVar3->m_worldTransform).m_origin.m_floats[0])),
                              ZEXT416((uint)(auVar11._0_4_ +
                                            (pcVar3->m_worldTransform).m_origin.m_floats[1])),0x10);
      local_58 = vinsertps_avx(auVar15,ZEXT416((uint)(auVar10._0_4_ +
                                                     (pcVar3->m_worldTransform).m_origin.m_floats[2]
                                                     )),0x28);
    }
    else {
      fVar21 = 1.0 / fVar21;
      auVar15 = vinsertps_avx(ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[2]),
                              ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[2]),
                              0x10);
      auVar10 = vinsertps_avx(ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[1]),
                              ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[1]),
                              0x10);
      fVar29 = fVar21 * 0.0 * fVar6 + auVar11._0_4_ * fVar29;
      fVar28 = fVar28 * fVar21 * fVar6 + 0.0;
      fVar6 = fVar20 * fVar21 * fVar6 + 0.0;
      auVar11 = vinsertps_avx(ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[0]),
                              ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[0]),
                              0x10);
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (pcVar3->m_worldTransform).m_basis.m_el[2].
                                                        m_floats[1])),ZEXT416((uint)fVar28),
                                ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[0]
                                       ));
      auVar27._4_4_ = fVar28;
      auVar27._0_4_ = fVar28;
      auVar27._8_4_ = fVar28;
      auVar27._12_4_ = fVar28;
      auVar17._0_4_ = fVar29 * auVar10._0_4_;
      auVar17._4_4_ = fVar29 * auVar10._4_4_;
      auVar17._8_4_ = fVar29 * auVar10._8_4_;
      auVar17._12_4_ = fVar29 * auVar10._12_4_;
      auVar10 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar6),
                                ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[2]
                                       ));
      auVar11 = vfmadd213ps_fma(auVar27,auVar11,auVar17);
      auVar12._4_4_ = fVar6;
      auVar12._0_4_ = fVar6;
      auVar12._8_4_ = fVar6;
      auVar12._12_4_ = fVar6;
      fVar6 = auVar10._0_4_ + (pcVar3->m_worldTransform).m_origin.m_floats[2];
      auVar15 = vfmadd213ps_fma(auVar12,auVar15,auVar11);
      local_58._8_8_ = vmovlps_avx(ZEXT416((uint)fVar6));
      uVar18 = *(undefined8 *)(pcVar3->m_worldTransform).m_origin.m_floats;
      auVar10._0_4_ = auVar15._0_4_ + (float)uVar18;
      auVar10._4_4_ = auVar15._4_4_ + (float)((ulong)uVar18 >> 0x20);
      auVar10._8_4_ = auVar15._8_4_ + 0.0;
      auVar10._12_4_ = auVar15._12_4_ + 0.0;
      local_58._0_8_ = vmovlps_avx(auVar10);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(body0->m_collisionObject->m_worldTransform).m_origin.m_floats;
      fVar6 = (body0->m_collisionObject->m_worldTransform).m_origin.m_floats[2] - fVar6;
      auVar11 = vsubps_avx(auVar24,auVar10);
      fVar28 = auVar11._0_4_;
      auVar25._0_4_ = fVar28 * fVar28;
      fVar20 = auVar11._4_4_;
      auVar25._4_4_ = fVar20 * fVar20;
      fVar21 = auVar11._8_4_;
      auVar25._8_4_ = fVar21 * fVar21;
      fVar29 = auVar11._12_4_;
      auVar25._12_4_ = fVar29 * fVar29;
      auVar15 = vmovshdup_avx(auVar25);
      auVar15 = vfmadd231ss_fma(auVar15,auVar11,auVar11);
      auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      auVar15 = vsqrtss_avx(auVar15,auVar15);
      fVar26 = 1.0 / auVar15._0_4_;
      auVar16._0_4_ = fVar28 * fVar26;
      auVar16._4_4_ = fVar20 * fVar26;
      auVar16._8_4_ = fVar21 * fVar26;
      auVar16._12_4_ = fVar29 * fVar26;
      local_68 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar6 * fVar26)),0x28);
      uVar19 = (ulong)(uint)(auVar15._0_4_ - fVar5);
    }
  }
  else {
    auVar11 = vaddss_avx512f(auVar17,ZEXT416((uint)fVar5));
    local_68 = auVar12;
    if (auVar11._0_4_ < fVar21) goto LAB_007eb0a3;
    fVar6 = (pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[1];
    auVar10 = ZEXT816(0) << 0x40;
    auVar22 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[1]);
    auVar32 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[1]);
    auVar31 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[0]);
    auVar25 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[0]);
    auVar27 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[0]);
    auVar16 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[0].m_floats[2]);
    auVar24 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[1].m_floats[2]);
    auVar23 = ZEXT416((uint)(pcVar3->m_worldTransform).m_basis.m_el[2].m_floats[2]);
    if (1.1920929e-07 < fVar21) {
      auVar10 = vinsertps_avx512f(auVar22,auVar32,0x10);
      fVar29 = 1.0 / fVar21;
      fVar5 = fVar29 * 0.0;
      fVar20 = fVar20 * fVar29;
      auVar14._4_4_ = fVar5;
      auVar14._0_4_ = fVar5;
      auVar14._8_4_ = fVar5;
      auVar14._12_4_ = fVar5;
      auVar12 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar28 * fVar29)));
      auVar13 = vmulps_avx512vl(auVar14,auVar10);
      auVar10 = vinsertps_avx512f(auVar31,auVar25,0x10);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),auVar27,
                                ZEXT416((uint)(fVar28 * fVar29)));
      auVar13 = vfmadd213ps_avx512vl(auVar12,auVar10,auVar13);
      auVar30._4_4_ = fVar20;
      auVar30._0_4_ = fVar20;
      auVar30._8_4_ = fVar20;
      auVar30._12_4_ = fVar20;
      auVar12 = vinsertps_avx512f(auVar16,auVar24,0x10);
      auVar10 = vfmadd231ss_fma(auVar14,auVar23,ZEXT416((uint)fVar20));
      auVar12 = vfmadd213ps_avx512vl(auVar30,auVar12,auVar13);
      local_68 = vinsertps_avx(auVar12,auVar10,0x28);
    }
    uVar19 = (ulong)(uint)(fVar21 - auVar11._0_4_);
    auVar14 = vbroadcastss_avx512vl(auVar15);
    auVar11 = vinsertps_avx(auVar22,auVar32,0x10);
    auVar31 = vinsertps_avx(auVar31,auVar25,0x10);
    auVar22._0_4_ = auVar11._0_4_ * auVar14._0_4_;
    auVar22._4_4_ = auVar11._4_4_ * auVar14._4_4_;
    auVar22._8_4_ = auVar11._8_4_ * auVar14._8_4_;
    auVar22._12_4_ = auVar11._12_4_ * auVar14._12_4_;
    auVar15 = vmulss_avx512f(auVar15,ZEXT416((uint)fVar6));
    auVar25 = vfmadd213ss_fma(auVar27,ZEXT816(0) << 0x40,auVar15);
    auVar11 = vfmadd213ps_fma(auVar31,ZEXT816(0),auVar22);
    auVar15 = vinsertps_avx(auVar16,auVar24,0x10);
    uVar18 = *(undefined8 *)(pcVar3->m_worldTransform).m_origin.m_floats;
    auVar16 = vbroadcastss_avx512vl(auVar17);
    auVar17 = vmulss_avx512f(auVar17,auVar10);
    auVar10 = vfmadd213ss_fma(auVar23,ZEXT816(0) << 0x40,auVar25);
    auVar15 = vfmadd213ps_fma(auVar15,ZEXT816(0),auVar11);
    auVar23._0_4_ = auVar15._0_4_ + (float)uVar18 + auVar16._0_4_ * auVar12._0_4_;
    auVar23._4_4_ = auVar15._4_4_ + (float)((ulong)uVar18 >> 0x20) + auVar16._4_4_ * auVar12._4_4_;
    auVar23._8_4_ = auVar15._8_4_ + 0.0 + auVar16._8_4_ * auVar12._8_4_;
    auVar23._12_4_ = auVar15._12_4_ + 0.0 + auVar16._12_4_ * auVar12._12_4_;
    local_58 = vinsertps_avx(auVar23,ZEXT416((uint)(auVar17._0_4_ +
                                                   auVar10._0_4_ +
                                                   (pcVar3->m_worldTransform).m_origin.m_floats[2]))
                             ,0x28);
  }
  (*(resultOut->super_Result)._vptr_Result[4])(uVar19,resultOut,local_68,local_58);
LAB_007eb0a3:
  this_00 = resultOut->m_manifoldPtr;
  if (this_00->m_cachedPoints != 0) {
    pcVar2 = resultOut->m_body0Wrap->m_collisionObject;
    pcVar3 = resultOut->m_body1Wrap->m_collisionObject;
    pcVar8 = pcVar3;
    if (this_00->m_body0 == pcVar2) {
      pcVar8 = pcVar2;
      pcVar2 = pcVar3;
    }
    cbtPersistentManifold::refreshContactPoints
              (this_00,&pcVar8->m_worldTransform,&pcVar2->m_worldTransform);
  }
  return;
}

Assistant:

void cbtSphereCylinderCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                           const cbtCollisionObjectWrapper* body1,
                                                           const cbtDispatcherInfo& dispatchInfo,
                                                           cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* sphereObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtSphereShape* sphere0 = (cbtSphereShape*)sphereObjWrap->getCollisionShape();
    const cbtCylinderShape* cylinder = (cbtCylinderShape*)cylObjWrap->getCollisionShape();

    const cbtTransform& m44T = cylObjWrap->getCollisionObject()->getWorldTransform();
    cbtVector3 diff = m44T.invXform(
        sphereObjWrap->getCollisionObject()
            ->getWorldTransform()
            .getOrigin());  // col0->getWorldTransform().getOrigin()-  col1->getWorldTransform().getOrigin();
    cbtScalar radius0 = sphere0->getRadius();
    cbtScalar radius1 = cylinder->getHalfExtentsWithMargin().getX();  // cylinder->getRadius();
    cbtScalar H1 = cylinder->getHalfExtentsWithMargin().getY();

    cbtVector3 r1 = diff;
    r1.setY(0);

    cbtScalar y1 = diff.y();

    cbtScalar r1_len = r1.length();

    cbtVector3 pos1;
    cbtVector3 normalOnSurfaceB(1, 0, 0);
    cbtScalar dist;

    // Case A
    if ((y1 <= H1) && (y1 >= -H1)) {
        /// iff distance positive, don't generate a new contact
        if (r1_len > (radius0 + radius1)) {
            resultOut->refreshContactPoints();
            return;
        }
        /// distance (negative means penetration)
        dist = r1_len - (radius0 + radius1);

        cbtVector3 localnormalOnSurfaceB;
        if (r1_len > SIMD_EPSILON) {
            localnormalOnSurfaceB = r1 / r1_len;
            normalOnSurfaceB = m44T.getBasis() * localnormalOnSurfaceB;
        }
        /// point on B (worldspace)
        pos1 = m44T(cbtVector3(0, y1, 0)) + radius1 * normalOnSurfaceB;
    } else {
        cbtScalar side = 1;
        if (y1 < -H1)
            side = -1;

        if (r1_len > radius1) {
            // case B
            cbtVector3 pos_loc = r1.normalized() * radius1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            cbtVector3 d = sphereObjWrap->getCollisionObject()->getWorldTransform().getOrigin() - pos1;
            normalOnSurfaceB = d.normalized();
            dist = d.length() - radius0;
        } else {
            // case C
            normalOnSurfaceB = m44T.getBasis() * cbtVector3(0, 1 * side, 0);
            cbtVector3 pos_loc = r1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            dist = side * (y1 - H1) - radius0;
        }
    }
    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

    resultOut->refreshContactPoints();
}